

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O3

void __thiscall
QGraphicsPathItem::paint
          (QGraphicsPathItem *this,QPainter *painter,QStyleOptionGraphicsItem *option,
          QWidget *widget)

{
  QPainter::setPen((QPen *)painter);
  QPainter::setBrush((QBrush *)painter);
  QPainter::drawPath((QPainterPath *)painter);
  if (((option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
       super_QFlagsStorage<QStyle::StateFlag>.i & 0x8000) == 0) {
    return;
  }
  qt_graphicsItem_highlightSelected((QGraphicsItem *)this,painter,option);
  return;
}

Assistant:

void QGraphicsPathItem::paint(QPainter *painter, const QStyleOptionGraphicsItem *option,
                              QWidget *widget)
{
    Q_D(QGraphicsPathItem);
    Q_UNUSED(widget);
    painter->setPen(d->pen);
    painter->setBrush(d->brush);
    painter->drawPath(d->path);

    if (option->state & QStyle::State_Selected)
        qt_graphicsItem_highlightSelected(this, painter, option);
}